

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

double min(DataSet *dataset)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  uint i;
  uint index;
  double dVar2;
  double local_80;
  Matrix<double> mat;
  
  DataSet::matrix(&mat,dataset);
  pvVar1 = Matrix<double>::operator[](&mat,0);
  local_80 = *(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  for (index = 0; index < mat.m_shape.n_row; index = index + 1) {
    pvVar1 = Matrix<double>::operator[](&mat,index);
    dVar2 = min(pvVar1,1);
    if (dVar2 < local_80) {
      pvVar1 = Matrix<double>::operator[](&mat,index);
      local_80 = min(pvVar1,1);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&mat.m_elems);
  return local_80;
}

Assistant:

double min(const DataSet& dataset){
    Matrix_d mat=dataset.matrix();
    double result=mat[0][0];
    for(unsigned i=0;i<mat.shape().n_row;++i){
        if(result>min(mat[i], 1)) result=min(mat[i], 1);
    }
    return result;
}